

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_parserInternals(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing parserInternals : 28 of 75 functions ...\n");
  }
  iVar1 = test_xmlCheckLanguageID();
  iVar2 = test_xmlCopyChar();
  iVar3 = test_xmlCopyCharMultiByte();
  iVar4 = test_xmlCreateEntityParserCtxt();
  iVar5 = test_xmlCreateFileParserCtxt();
  iVar6 = test_xmlCreateMemoryParserCtxt();
  iVar7 = test_xmlCreateURLParserCtxt();
  iVar8 = test_xmlCtxtErrMemory();
  iVar9 = test_xmlCtxtPopInput();
  iVar10 = test_xmlCtxtPushInput();
  iVar11 = test_xmlCurrentChar();
  iVar12 = test_xmlIsLetter();
  iVar13 = test_xmlNewEntityInputStream();
  iVar14 = test_xmlNewInputFromFile();
  iVar15 = test_xmlNewInputStream();
  iVar16 = test_xmlNewStringInputStream();
  iVar17 = test_xmlNextChar();
  iVar18 = test_xmlParserInputShrink();
  iVar19 = test_xmlPopInput();
  iVar20 = test_xmlPushInput();
  iVar21 = test_xmlSplitQName();
  iVar22 = test_xmlStringCurrentChar();
  iVar23 = test_xmlStringDecodeEntities();
  iVar24 = test_xmlStringLenDecodeEntities();
  iVar25 = test_xmlSwitchEncoding();
  iVar26 = test_xmlSwitchEncodingName();
  iVar27 = test_xmlSwitchInputEncoding();
  iVar28 = test_xmlSwitchToEncoding();
  uVar29 = iVar28 + iVar27 + iVar26 + iVar25 + iVar24 + iVar23 + iVar22 + iVar21 + iVar20 + iVar19 +
                                                                                            iVar18 +
                                                                                            iVar17 +
                                                                                            iVar16 +
                                                                                            iVar15 +
                                                                                            iVar14 +
                                                                                            iVar13 +
                                                                                            iVar12 +
                                                                                            iVar11 +
                                                                                            iVar10 +
                                                                                            iVar9 + 
                                                  iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + 
                                                  iVar2 + iVar1;
  if (uVar29 != 0) {
    printf("Module parserInternals: %d errors\n",(ulong)uVar29);
  }
  return uVar29;
}

Assistant:

static int
test_parserInternals(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing parserInternals : 28 of 75 functions ...\n");
    test_ret += test_xmlCheckLanguageID();
    test_ret += test_xmlCopyChar();
    test_ret += test_xmlCopyCharMultiByte();
    test_ret += test_xmlCreateEntityParserCtxt();
    test_ret += test_xmlCreateFileParserCtxt();
    test_ret += test_xmlCreateMemoryParserCtxt();
    test_ret += test_xmlCreateURLParserCtxt();
    test_ret += test_xmlCtxtErrMemory();
    test_ret += test_xmlCtxtPopInput();
    test_ret += test_xmlCtxtPushInput();
    test_ret += test_xmlCurrentChar();
    test_ret += test_xmlIsLetter();
    test_ret += test_xmlNewEntityInputStream();
    test_ret += test_xmlNewInputFromFile();
    test_ret += test_xmlNewInputStream();
    test_ret += test_xmlNewStringInputStream();
    test_ret += test_xmlNextChar();
    test_ret += test_xmlParserInputShrink();
    test_ret += test_xmlPopInput();
    test_ret += test_xmlPushInput();
    test_ret += test_xmlSplitQName();
    test_ret += test_xmlStringCurrentChar();
    test_ret += test_xmlStringDecodeEntities();
    test_ret += test_xmlStringLenDecodeEntities();
    test_ret += test_xmlSwitchEncoding();
    test_ret += test_xmlSwitchEncodingName();
    test_ret += test_xmlSwitchInputEncoding();
    test_ret += test_xmlSwitchToEncoding();

    if (test_ret != 0)
	printf("Module parserInternals: %d errors\n", test_ret);
    return(test_ret);
}